

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O0

void __thiscall flow::Value::Value(Value *this,LiteralType ty,string *name)

{
  ulong uVar1;
  string_view local_50;
  string local_40;
  string *local_20;
  string *name_local;
  Value *pVStack_10;
  LiteralType ty_local;
  Value *this_local;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_002ba620;
  this->type_ = ty;
  local_20 = name;
  name_local._4_4_ = ty;
  pVStack_10 = this;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  memset(&this->uses_,0,0x18);
  std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::vector(&this->uses_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    fmt::v5::basic_string_view<char>::basic_string_view(&local_50,"unnamed{}");
    fmt::v5::format<unsigned_long_long>(&local_40,local_50,(unsigned_long_long *)&valueCounter);
    std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    valueCounter = valueCounter + 1;
  }
  return;
}

Assistant:

Value::Value(LiteralType ty, const std::string& name)
    : type_(ty), name_(name), uses_() {
  if (name_.empty()) {
    name_ = fmt::format("unnamed{}", valueCounter);
    valueCounter++;
    // printf("default-create name: %s\n", name_.c_str());
  }
}